

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlParsePI(xmlParserCtxtPtr ctxt)

{
  xmlParserInputPtr pxVar1;
  processingInstructionSAXFunc UNRECOVERED_JUMPTABLE;
  bool bVar2;
  int iVar3;
  uint val;
  uint uVar4;
  uint uVar5;
  xmlCatalogAllow xVar6;
  xmlChar *pxVar7;
  xmlChar *pxVar8;
  uint uVar9;
  long lVar10;
  int l;
  xmlChar *local_50;
  ulong local_40;
  int local_34;
  
  uVar9 = 1000000000;
  if (((uint)ctxt->options >> 0x13 & 1) == 0) {
    uVar9 = 10000000;
  }
  pxVar1 = ctxt->input;
  pxVar7 = pxVar1->cur;
  if ((*pxVar7 == '<') && (pxVar7[1] == '?')) {
    pxVar1->cur = pxVar7 + 2;
    pxVar1->col = pxVar1->col + 2;
    if (pxVar7[2] == '\0') {
      xmlParserGrow(ctxt);
    }
    pxVar7 = xmlParsePITarget(ctxt);
    if (pxVar7 == (xmlChar *)0x0) {
      xmlFatalErr(ctxt,XML_ERR_PI_NOT_STARTED,(char *)0x0);
      return;
    }
    pxVar1 = ctxt->input;
    pxVar8 = pxVar1->cur;
    if ((*pxVar8 == '?') && (pxVar8[1] == '>')) {
      pxVar1->cur = pxVar8 + 2;
      pxVar1->col = pxVar1->col + 2;
      if (pxVar8[2] == '\0') {
        xmlParserGrow(ctxt);
      }
      if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
         (UNRECOVERED_JUMPTABLE = ctxt->sax->processingInstruction,
         UNRECOVERED_JUMPTABLE != (processingInstructionSAXFunc)0x0)) {
        (*UNRECOVERED_JUMPTABLE)(ctxt->userData,pxVar7,(xmlChar *)0x0);
        return;
      }
    }
    else {
      local_50 = (xmlChar *)(*xmlMalloc)(100);
      if (local_50 == (xmlChar *)0x0) {
        xmlCtxtErrMemory(ctxt);
        return;
      }
      iVar3 = xmlSkipBlankChars(ctxt);
      if (iVar3 == 0) {
        xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_SPACE_REQUIRED,XML_ERR_FATAL,pxVar7,
                   (xmlChar *)0x0,(xmlChar *)0x0,0,"ParsePI: PI %s space expected\n",pxVar7);
      }
      local_40 = 100;
      lVar10 = 0;
      while( true ) {
        val = xmlCurrentChar(ctxt,&local_34);
        if (val == 0x200000) {
          val = 0xfffd;
        }
        if (0xff < (int)val) break;
        if ((int)val < 0x20) {
          if ((0xd < val) || ((0x2600U >> (val & 0x1f) & 1) == 0)) goto LAB_00136a0c;
        }
        else {
LAB_001368a7:
          if ((val == 0x3f) && (ctxt->input->cur[1] == '>')) goto LAB_00136a0c;
        }
        if (local_40 <= lVar10 + 5U) {
          if (local_40 == 0) {
            uVar5 = 1;
          }
          else {
            iVar3 = (int)local_40;
            uVar5 = 0xffffffff;
            if ((iVar3 < (int)uVar9) &&
               (uVar4 = iVar3 + 1U >> 1, uVar5 = uVar4 + iVar3, (int)(uVar9 - uVar4) < iVar3)) {
              uVar5 = uVar9;
            }
          }
          if ((int)uVar5 < 0) {
            xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_PI_NOT_FINISHED,XML_ERR_FATAL,
                       pxVar7,(xmlChar *)0x0,(xmlChar *)0x0,0,"PI %s too big found",pxVar7);
LAB_00136976:
            (*xmlFree)(local_50);
            bVar2 = false;
          }
          else {
            pxVar8 = (xmlChar *)(*xmlRealloc)(local_50,(ulong)uVar5);
            if (pxVar8 == (xmlChar *)0x0) {
              xmlCtxtErrMemory(ctxt);
              goto LAB_00136976;
            }
            bVar2 = true;
            local_40 = (ulong)uVar5;
            local_50 = pxVar8;
          }
          if (!bVar2) {
            return;
          }
        }
        if ((int)val < 0x80) {
          local_50[lVar10] = (xmlChar)val;
          lVar10 = lVar10 + 1;
        }
        else {
          iVar3 = xmlCopyCharMultiByte(local_50 + lVar10,val);
          lVar10 = lVar10 + iVar3;
        }
        pxVar1 = ctxt->input;
        if (*pxVar1->cur == '\n') {
          pxVar1->line = pxVar1->line + 1;
          pxVar1->col = 1;
        }
        else {
          pxVar1->col = pxVar1->col + 1;
        }
        pxVar1->cur = pxVar1->cur + local_34;
      }
      if ((val - 0x10000 < 0x100000 || val - 0xe000 < 0x1ffe) || (int)val < 0xd800)
      goto LAB_001368a7;
LAB_00136a0c:
      local_50[lVar10] = '\0';
      if (val == 0x3f) {
        pxVar1 = ctxt->input;
        pxVar8 = pxVar1->cur;
        pxVar1->cur = pxVar8 + 2;
        pxVar1->col = pxVar1->col + 2;
        if (pxVar8[2] == '\0') {
          xmlParserGrow(ctxt);
        }
        if ((((ctxt->inSubset == 0) &&
             (iVar3 = xmlStrEqual(pxVar7,(xmlChar *)"oasis-xml-catalog"), iVar3 != 0)) &&
            (xVar6 = xmlCatalogGetDefaults(), (ctxt->options & 0x4000000) != 0)) &&
           ((xVar6 & ~XML_CATA_ALLOW_GLOBAL) == XML_CATA_ALLOW_DOCUMENT)) {
          xmlParseCatalogPI(ctxt,local_50);
        }
        if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
           (UNRECOVERED_JUMPTABLE = ctxt->sax->processingInstruction,
           UNRECOVERED_JUMPTABLE != (processingInstructionSAXFunc)0x0)) {
          (*UNRECOVERED_JUMPTABLE)(ctxt->userData,pxVar7,local_50);
        }
      }
      else {
        xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_PI_NOT_FINISHED,XML_ERR_FATAL,pxVar7
                   ,(xmlChar *)0x0,(xmlChar *)0x0,0,"ParsePI: PI %s never end ...\n",pxVar7);
      }
      (*xmlFree)(local_50);
    }
  }
  return;
}

Assistant:

void
xmlParsePI(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    size_t len = 0;
    size_t size = XML_PARSER_BUFFER_SIZE;
    size_t maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                       XML_MAX_HUGE_LENGTH :
                       XML_MAX_TEXT_LENGTH;
    int cur, l;
    const xmlChar *target;

    if ((RAW == '<') && (NXT(1) == '?')) {
	/*
	 * this is a Processing Instruction.
	 */
	SKIP(2);

	/*
	 * Parse the target name and check for special support like
	 * namespace.
	 */
        target = xmlParsePITarget(ctxt);
	if (target != NULL) {
	    if ((RAW == '?') && (NXT(1) == '>')) {
		SKIP(2);

		/*
		 * SAX: PI detected.
		 */
		if ((ctxt->sax) && (!ctxt->disableSAX) &&
		    (ctxt->sax->processingInstruction != NULL))
		    ctxt->sax->processingInstruction(ctxt->userData,
		                                     target, NULL);
		return;
	    }
	    buf = xmlMalloc(size);
	    if (buf == NULL) {
		xmlErrMemory(ctxt);
		return;
	    }
	    if (SKIP_BLANKS == 0) {
		xmlFatalErrMsgStr(ctxt, XML_ERR_SPACE_REQUIRED,
			  "ParsePI: PI %s space expected\n", target);
	    }
	    cur = xmlCurrentCharRecover(ctxt, &l);
	    while (IS_CHAR(cur) && /* checked */
		   ((cur != '?') || (NXT(1) != '>'))) {
		if (len + 5 >= size) {
		    xmlChar *tmp;
                    int newSize;

                    newSize = xmlGrowCapacity(size, 1, 1, maxLength);
                    if (newSize < 0) {
                        xmlFatalErrMsgStr(ctxt, XML_ERR_PI_NOT_FINISHED,
                                          "PI %s too big found", target);
                        xmlFree(buf);
                        return;
                    }
		    tmp = xmlRealloc(buf, newSize);
		    if (tmp == NULL) {
			xmlErrMemory(ctxt);
			xmlFree(buf);
			return;
		    }
		    buf = tmp;
                    size = newSize;
		}
		COPY_BUF(buf, len, cur);
		NEXTL(l);
		cur = xmlCurrentCharRecover(ctxt, &l);
	    }
	    buf[len] = 0;
	    if (cur != '?') {
		xmlFatalErrMsgStr(ctxt, XML_ERR_PI_NOT_FINISHED,
		      "ParsePI: PI %s never end ...\n", target);
	    } else {
		SKIP(2);

#ifdef LIBXML_CATALOG_ENABLED
		if ((ctxt->inSubset == 0) &&
		    (xmlStrEqual(target, XML_CATALOG_PI))) {
		    xmlCatalogAllow allow = xmlCatalogGetDefaults();

		    if ((ctxt->options & XML_PARSE_CATALOG_PI) &&
                        ((allow == XML_CATA_ALLOW_DOCUMENT) ||
			 (allow == XML_CATA_ALLOW_ALL)))
			xmlParseCatalogPI(ctxt, buf);
		}
#endif

		/*
		 * SAX: PI detected.
		 */
		if ((ctxt->sax) && (!ctxt->disableSAX) &&
		    (ctxt->sax->processingInstruction != NULL))
		    ctxt->sax->processingInstruction(ctxt->userData,
		                                     target, buf);
	    }
	    xmlFree(buf);
	} else {
	    xmlFatalErr(ctxt, XML_ERR_PI_NOT_STARTED, NULL);
	}
    }
}